

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llbuild::buildsystem::BuildKey,_1U>::~SmallVector
          (SmallVector<llbuild::buildsystem::BuildKey,_1U> *this)

{
  BuildKey *S;
  void *pvVar1;
  size_t sVar2;
  SmallVector<llbuild::buildsystem::BuildKey,_1U> *this_local;
  
  S = (BuildKey *)
      (this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
      super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      BeginX;
  pvVar1 = (this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
           super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
           super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::destroy_range
            (S,(BuildKey *)((long)pvVar1 + sVar2 * 0x20));
  SmallVectorImpl<llbuild::buildsystem::BuildKey>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }